

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O3

void __thiscall
ThreadedReplayer::compute_parents_depth<ThreadedReplayer::DeferredComputeInfo>
          (ThreadedReplayer *this,
          unordered_map<unsigned_long,_ThreadedReplayer::DeferredComputeInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>_>
          *parents,unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
                   *parents_depth,DeferredComputeInfo *info,uint32_t depth)

{
  iterator iVar1;
  mapped_type *pmVar2;
  const_iterator cVar3;
  VkBaseInStructure *sin;
  int *piVar4;
  uint uVar5;
  ulong uVar6;
  __hashtable *__h;
  __hashtable *__h_2;
  Hash parent;
  key_type local_38;
  
  iVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&parents_depth->_M_h,&info->hash);
  if (iVar1.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_int>,_false>._M_cur !=
      (__node_type *)0x0) {
    uVar5 = *(uint *)((long)iVar1.
                            super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_int>,_false>
                            ._M_cur + 0x10);
    if (*(uint *)((long)iVar1.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_int>,_false>
                        ._M_cur + 0x10) <= depth) {
      uVar5 = depth;
    }
    pmVar2 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)parents_depth,&info->hash);
    *pmVar2 = uVar5;
    if (info->info != (VkComputePipelineCreateInfo *)0x0) {
      for (piVar4 = (int *)info->info->pNext; piVar4 != (int *)0x0; piVar4 = *(int **)(piVar4 + 2))
      {
        if (*piVar4 == 0x3b9f36d0) {
          if (piVar4[4] == 0) {
            return;
          }
          uVar6 = 0;
          goto LAB_0014f6c6;
        }
      }
    }
    return;
  }
LAB_0014f73e:
  std::__throw_out_of_range("_Map_base::at");
LAB_0014f6c6:
  local_38 = *(key_type *)(*(long *)(piVar4 + 6) + uVar6 * 8);
  cVar3 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&parents->_M_h,&local_38);
  if (cVar3.
      super__Node_iterator_base<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>,_false>
      ._M_cur != (__node_type *)0x0) {
    iVar1 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&parents_depth->_M_h,&local_38);
    if (iVar1.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_int>,_false>._M_cur
        == (__node_type *)0x0) goto LAB_0014f73e;
    if (*(uint *)((long)iVar1.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_int>,_false>
                        ._M_cur + 0x10) <= depth) {
      cVar3 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&parents->_M_h,&local_38);
      if (cVar3.
          super__Node_iterator_base<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>,_false>
          ._M_cur == (__node_type *)0x0) goto LAB_0014f73e;
      compute_parents_depth<ThreadedReplayer::DeferredComputeInfo>
                (this,parents,parents_depth,
                 (DeferredComputeInfo *)
                 ((long)cVar3.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>,_false>
                        ._M_cur + 0x10),depth + 1);
    }
  }
  uVar6 = uVar6 + 1;
  if ((uint)piVar4[4] <= uVar6) {
    return;
  }
  goto LAB_0014f6c6;
}

Assistant:

void compute_parents_depth(const unordered_map<Hash, DerivedInfo> &parents,
	                           unordered_map<Hash, uint32_t> &parents_depth,
	                           const DerivedInfo &info, uint32_t depth)
	{
		parents_depth[info.hash] = max(parents_depth.at(info.hash), depth);

		auto library = work_item_get_library_info(info);
		if (!library)
			return;

		for (uint32_t i = 0; i < library->libraryCount; i++)
		{
			Hash parent = (Hash)library->pLibraries[i];
			if (parents.count(parent) != 0 && parents_depth.at(parent) <= depth)
				compute_parents_depth(parents, parents_depth, parents.at(parent), depth + 1);
		}
	}